

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RGP.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::Policies::RGP::list_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,RGP *this)

{
  Client *client;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  Url local_38;
  RGP *local_18;
  RGP *this_local;
  
  client = *(Client **)this;
  local_58.field_2._M_allocated_capacity = 0;
  local_58.field_2._8_8_ = 0;
  local_58._M_dataplus = (_Alloc_hider)0x0;
  local_58._1_7_ = 0;
  local_58._M_string_length = 0;
  local_18 = this;
  this_local = (RGP *)__return_storage_ptr__;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny((Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&local_58);
  getUrl(&local_38,this,(Path *)&local_58);
  Policies::list(__return_storage_ptr__,client,&local_38);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_38);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny((Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Sys::Policies::RGP::list() {
  return Vault::Sys::Policies::list(client_, getUrl(Path{}));
}